

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<int>::Swap(RepeatedField<int> *this,RepeatedField<int> *other)

{
  int iVar1;
  void *pvVar2;
  undefined8 uVar3;
  void *__tmp;
  void **ppvVar4;
  void **ppvVar5;
  long lVar6;
  RepeatedField<int> local_30;
  
  if (this != other) {
    pvVar2 = this->arena_or_elements_;
    ppvVar4 = (void **)((long)pvVar2 + -8);
    if (this->total_size_ == 0) {
      ppvVar4 = &this->arena_or_elements_;
    }
    ppvVar5 = (void **)((long)other->arena_or_elements_ + -8);
    if (other->total_size_ == 0) {
      ppvVar5 = &other->arena_or_elements_;
    }
    if ((Arena *)*ppvVar4 == (Arena *)*ppvVar5) {
      this->arena_or_elements_ = other->arena_or_elements_;
      other->arena_or_elements_ = pvVar2;
      iVar1 = this->current_size_;
      this->current_size_ = other->current_size_;
      other->current_size_ = iVar1;
      iVar1 = this->total_size_;
      this->total_size_ = other->total_size_;
      other->total_size_ = iVar1;
    }
    else {
      RepeatedField(&local_30,(Arena *)*ppvVar5);
      if (this->current_size_ != 0) {
        lVar6 = (long)local_30.current_size_;
        Reserve(&local_30,this->current_size_ + local_30.current_size_);
        local_30.current_size_ = local_30.current_size_ + this->current_size_;
        memcpy((void *)(lVar6 * 4 + (long)local_30.arena_or_elements_),this->arena_or_elements_,
               (long)this->current_size_ << 2);
      }
      this->current_size_ = 0;
      if (other->current_size_ != 0) {
        Reserve(this,other->current_size_);
        this->current_size_ = this->current_size_ + other->current_size_;
        memcpy(this->arena_or_elements_,other->arena_or_elements_,(long)other->current_size_ << 2);
      }
      if (&local_30 != other) {
        pvVar2 = other->arena_or_elements_;
        other->arena_or_elements_ = local_30.arena_or_elements_;
        uVar3._0_4_ = other->current_size_;
        uVar3._4_4_ = other->total_size_;
        other->current_size_ = local_30.current_size_;
        other->total_size_ = local_30.total_size_;
        local_30._0_8_ = uVar3;
        local_30.arena_or_elements_ = pvVar2;
      }
      ~RepeatedField(&local_30);
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  if (GetArenaNoVirtual() == other->GetArenaNoVirtual()) {
    InternalSwap(other);
  } else {
    RepeatedField<Element> temp(other->GetArenaNoVirtual());
    temp.MergeFrom(*this);
    CopyFrom(*other);
    other->UnsafeArenaSwap(&temp);
  }
}